

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O1

Vec_Int_t * Proof_CollectUsedRec(Vec_Set_t *vProof,Vec_Int_t *vRoots)

{
  Vec_Int_t *vUsed;
  int *piVar1;
  long lVar2;
  
  vUsed = (Vec_Int_t *)malloc(0x10);
  vUsed->nCap = 1000;
  vUsed->nSize = 0;
  piVar1 = (int *)malloc(4000);
  vUsed->pArray = piVar1;
  if (0 < vRoots->nSize) {
    lVar2 = 0;
    do {
      if (-1 < vRoots->pArray[lVar2]) {
        Proof_CollectUsed_rec(vProof,vRoots->pArray[lVar2],vUsed);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < vRoots->nSize);
  }
  return vUsed;
}

Assistant:

Vec_Int_t * Proof_CollectUsedRec( Vec_Set_t * vProof, Vec_Int_t * vRoots )
{
    Vec_Int_t * vUsed;
    int i, Entry;
    vUsed = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vRoots, Entry, i )
        if ( Entry >= 0 )
            Proof_CollectUsed_rec( vProof, Entry, vUsed );
    return vUsed;
}